

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QCborMap __thiscall QCborValue::toMap(QCborValue *this)

{
  QCborMap *in_RSI;
  long in_FS_OFFSET;
  QCborMap QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::QCborMap(&QStack_28);
  toMap(this,in_RSI);
  QCborMap::~QCborMap(&QStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborValue::toMap() const
{
    return toMap(QCborMap());
}